

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_fourier_transform.h
# Opt level: O1

void __thiscall
sptk::DiscreteFourierTransform::~DiscreteFourierTransform(DiscreteFourierTransform *this)

{
  ~DiscreteFourierTransform(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~DiscreteFourierTransform() {
  }